

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int cvLsJacBWrapper(sunrealtype t,N_Vector yB,N_Vector fyB,SUNMatrix JB,void *cvode_mem,
                   N_Vector tmp1B,N_Vector tmp2B,N_Vector tmp3B)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_stack_00000008;
  int retval;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeBMem *in_stack_ffffffffffffff88;
  CVadjMem *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  long local_50;
  CVodeMem local_48;
  int local_4;
  
  local_4 = cvLs_AccessLMemBCur(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                (CVodeMem *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                (CVLsMemB *)0x13e185);
  if (local_4 == 0) {
    iVar1 = (**(code **)(local_50 + 0xa8))(in_XMM0_Qa,local_48,*(undefined8 *)(local_50 + 0x1f8),0);
    if (iVar1 == 0) {
      local_4 = (**(code **)in_stack_ffffffffffffffa0)
                          (in_XMM0_Qa,*(undefined8 *)(local_50 + 0x1f8),in_RDI,in_RSI,in_RDX,
                           *(undefined8 *)((long)in_stack_ffffffffffffffa8 + 0x40),in_R8,in_R9,
                           in_stack_00000008);
    }
    else {
      cvProcessError(local_48,-1,0x98b,"cvLsJacBWrapper",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"Bad t for interpolation.");
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int cvLsJacBWrapper(sunrealtype t, N_Vector yB, N_Vector fyB,
                           SUNMatrix JB, void* cvode_mem, N_Vector tmp1B,
                           N_Vector tmp2B, N_Vector tmp3B)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemBCur(cvode_mem, "cvLsJacBWrapper", &cv_mem, &ca_mem,
                               &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Forward solution from interpolation */
  retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSG_LS_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint jacB routine (of type CVLsJacFnB) */
  return (cvlsB_mem->jacB(t, ca_mem->ca_ytmp, yB, fyB, JB,
                          cvB_mem->cv_user_data, tmp1B, tmp2B, tmp3B));
}